

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

size_t __thiscall slang::SourceManager::getLineNumber(SourceManager *this,SourceLocation location)

{
  BufferID BVar1;
  SourceLocation in_RDI;
  LineDirectiveInfo *lineDirective;
  FileInfo *info;
  size_t rawLineNumber;
  SourceLocation fileLocation;
  shared_lock<std::shared_mutex> lock;
  mutex_type *in_stack_ffffffffffffff48;
  LineDirectiveInfo *in_stack_ffffffffffffff50;
  shared_lock<std::shared_mutex> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  pointer pLVar2;
  FileInfo *this_00;
  SourceManager *in_stack_ffffffffffffff80;
  SourceLocation in_stack_ffffffffffffff88;
  FileData *in_stack_ffffffffffffffd8;
  SourceManager *in_stack_ffffffffffffffe0;
  SourceLocation location_00;
  pointer local_8;
  
  this_00 = (FileInfo *)&stack0xffffffffffffffd8;
  location_00 = in_RDI;
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  getFullyExpandedLocImpl<std::shared_lock<std::shared_mutex>_>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
             (shared_lock<std::shared_mutex> *)this_00);
  local_8 = (pointer)getRawLineNumber<std::shared_lock<std::shared_mutex>_>
                               (in_stack_ffffffffffffffe0,location_00,
                                (shared_lock<std::shared_mutex> *)in_stack_ffffffffffffffd8);
  if (local_8 == (pointer)0x0) {
    local_8 = (pointer)0x0;
  }
  else {
    pLVar2 = local_8;
    BVar1 = SourceLocation::buffer((SourceLocation *)in_stack_ffffffffffffff58);
    getFileInfo<std::shared_lock<std::shared_mutex>_>
              ((SourceManager *)CONCAT44(BVar1.id,in_stack_ffffffffffffff60),
               (BufferID)(uint32_t)((ulong)pLVar2 >> 0x20),in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff50 = FileInfo::getPreviousLineDirective(this_00,(size_t)in_RDI);
    if (in_stack_ffffffffffffff50 != (LineDirectiveInfo *)0x0) {
      local_8 = (pointer)((long)local_8 +
                         (in_stack_ffffffffffffff50->lineOfDirective -
                         in_stack_ffffffffffffff50->lineInFile) + -1);
    }
  }
  std::shared_lock<std::shared_mutex>::~shared_lock
            ((shared_lock<std::shared_mutex> *)in_stack_ffffffffffffff50);
  return (size_t)local_8;
}

Assistant:

size_t SourceManager::getLineNumber(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    SourceLocation fileLocation = getFullyExpandedLocImpl(location, lock);
    size_t rawLineNumber = getRawLineNumber(fileLocation, lock);
    if (rawLineNumber == 0)
        return 0;

    auto info = getFileInfo(fileLocation.buffer(), lock);

    auto lineDirective = info->getPreviousLineDirective(rawLineNumber);
    if (!lineDirective)
        return rawLineNumber;
    else
        return lineDirective->lineOfDirective + (rawLineNumber - lineDirective->lineInFile) - 1;
}